

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O0

SQInteger sqstd_register_stringlib(HSQUIRRELVM v)

{
  SQChar *in_RDI;
  SQRegFunction *f;
  SQInteger i;
  HSQUIRRELVM in_stack_00000018;
  HSQUIRRELVM in_stack_00000020;
  SQFUNCTION in_stack_00000028;
  HSQUIRRELVM in_stack_00000030;
  HSQUIRRELVM in_stack_00000038;
  SQChar *in_stack_00000048;
  SQInteger in_stack_00000050;
  HSQUIRRELVM in_stack_00000058;
  long local_10;
  
  sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
  sq_newclass(in_stack_00000038,(SQBool)in_stack_00000030);
  for (local_10 = 0; rexobj_funcs[local_10].name != (SQChar *)0x0; local_10 = local_10 + 1) {
    sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
    sq_newclosure(in_stack_00000030,in_stack_00000028,(SQUnsignedInteger)in_stack_00000020);
    sq_setparamscheck(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    sq_setnativeclosurename((HSQUIRRELVM)i,(SQInteger)f,in_RDI);
    sq_newslot(in_stack_00000018,(SQInteger)v,i);
  }
  sq_newslot(in_stack_00000018,(SQInteger)v,i);
  for (local_10 = 0; stringlib_funcs[local_10].name != (SQChar *)0x0; local_10 = local_10 + 1) {
    sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
    sq_newclosure(in_stack_00000030,in_stack_00000028,(SQUnsignedInteger)in_stack_00000020);
    sq_setparamscheck(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    sq_setnativeclosurename((HSQUIRRELVM)i,(SQInteger)f,in_RDI);
    sq_newslot(in_stack_00000018,(SQInteger)v,i);
  }
  return 1;
}

Assistant:

SQInteger sqstd_register_stringlib(HSQUIRRELVM v)
{
    sq_pushstring(v,_SC("regexp"),-1);
    sq_newclass(v,SQFalse);
    SQInteger i = 0;
    while(rexobj_funcs[i].name != 0) {
        const SQRegFunction &f = rexobj_funcs[i];
        sq_pushstring(v,f.name,-1);
        sq_newclosure(v,f.f,0);
        sq_setparamscheck(v,f.nparamscheck,f.typemask);
        sq_setnativeclosurename(v,-1,f.name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    sq_newslot(v,-3,SQFalse);

    i = 0;
    while(stringlib_funcs[i].name!=0)
    {
        sq_pushstring(v,stringlib_funcs[i].name,-1);
        sq_newclosure(v,stringlib_funcs[i].f,0);
        sq_setparamscheck(v,stringlib_funcs[i].nparamscheck,stringlib_funcs[i].typemask);
        sq_setnativeclosurename(v,-1,stringlib_funcs[i].name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    return 1;
}